

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalinterrupt.cpp
# Opt level: O1

void __thiscall util::SignalInterrupt::SignalInterrupt(SignalInterrupt *this)

{
  TokenPipeEnd *this_00;
  char *pcVar1;
  TokenPipeEnd *this_01;
  long in_FS_OFFSET;
  optional<TokenPipe> pipe;
  TokenPipe local_50;
  undefined8 local_48;
  TokenPipe local_3c;
  char local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_flag)._M_base._M_i = false;
  this_00 = &this->m_pipe_r;
  TokenPipeEnd::TokenPipeEnd(this_00,-1);
  this_01 = &this->m_pipe_w;
  TokenPipeEnd::TokenPipeEnd(this_01,-1);
  TokenPipe::Make();
  if (local_34 == '\0') {
    pcVar1 = (char *)__cxa_allocate_exception(0x20);
    local_48 = std::iostream_category();
    local_50.m_fds[0] = 1;
    std::ios_base::failure[abi:cxx11]::failure(pcVar1,(error_code *)"Could not create TokenPipe");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    TokenPipe::TakeReadEnd(&local_50);
    TokenPipeEnd::Close(this_00);
    this_00->m_fd = local_50.m_fds[0];
    local_50.m_fds[0] = -1;
    TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)&local_50);
    TokenPipe::TakeWriteEnd(&local_50);
    TokenPipeEnd::Close(this_01);
    this_01->m_fd = local_50.m_fds[0];
    local_50.m_fds[0] = -1;
    TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)&local_50);
    if (local_34 == '\x01') {
      local_34 = '\0';
      TokenPipe::~TokenPipe(&local_3c);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

SignalInterrupt::SignalInterrupt() : m_flag{false}
{
#ifndef WIN32
    std::optional<TokenPipe> pipe = TokenPipe::Make();
    if (!pipe) throw std::ios_base::failure("Could not create TokenPipe");
    m_pipe_r = pipe->TakeReadEnd();
    m_pipe_w = pipe->TakeWriteEnd();
#endif
}